

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestReader.cpp
# Opt level: O1

void __thiscall OpenMD::RestReader::readReferenceStructure(RestReader *this)

{
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *this_00;
  double dVar1;
  pointer pVVar2;
  uint i_1;
  Molecule *propName;
  long lVar3;
  MolecularRestraint *pMVar4;
  pointer ppSVar5;
  StuntDouble *pSVar6;
  long lVar7;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> ref;
  shared_ptr<OpenMD::GenericData> data;
  MoleculeIterator i;
  Vector<double,_3U> result;
  undefined1 local_108 [32];
  pointer local_e8 [2];
  pointer local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  double local_c8;
  undefined1 local_c0 [16];
  RestReader *local_b0;
  MolecularRestraint *local_a8;
  MoleculeIterator local_a0;
  pointer local_98 [2];
  pointer local_88;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_80;
  pointer local_68 [4];
  Vector3d local_48;
  
  this_00 = &this->all_pos_;
  pVVar2 = (this->all_pos_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->all_pos_).
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish != pVVar2) {
    (this->all_pos_).
    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar2;
  }
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            (this_00,(long)this->info_->nGlobalIntegrableObjects_);
  scanFile(this);
  readSet(this);
  local_a0._M_node = (_Base_ptr)0x0;
  propName = SimInfo::beginMolecule(this->info_,&local_a0);
  local_b0 = this;
  while (propName != (Molecule *)0x0) {
    local_108._0_8_ = (pointer)(local_108 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Restraint","");
    Molecule::getPropertyByName((Molecule *)local_c0,(string *)propName);
    if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_,
                      (ulong)((long)((Vector<double,_3U> *)local_108._16_8_)->data_ + 1));
    }
    if ((_func_int **)local_c0._0_8_ != (_func_int **)0x0) {
      lVar3 = __dynamic_cast(local_c0._0_8_,&GenericData::typeinfo,
                             &SimpleTypeData<OpenMD::Restraint*>::typeinfo,0);
      lVar7 = 0;
      local_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((lVar3 != 0) &&
         (lVar7 = lVar3, local_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_,
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_c0._8_8_ + 8) = *(_Atomic_word *)(local_c0._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_c0._8_8_ + 8) = *(_Atomic_word *)(local_c0._8_8_ + 8) + 1;
        }
      }
      if (lVar7 != 0) {
        if (*(long *)(lVar7 + 0x28) == 0) {
          pMVar4 = (MolecularRestraint *)0x0;
        }
        else {
          pMVar4 = (MolecularRestraint *)
                   __dynamic_cast(*(long *)(lVar7 + 0x28),&Restraint::typeinfo,
                                  &MolecularRestraint::typeinfo);
        }
        if (pMVar4 == (MolecularRestraint *)0x0) {
          builtin_strncpy(painCave.errMsg,"Can not cast RestraintData to MolecularRestraint\n",0x32)
          ;
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        else {
          local_108._0_8_ = (pointer)0x0;
          local_108._8_8_ = (pointer)0x0;
          local_108._16_8_ = (pointer)0x0;
          local_d8 = (pointer)0x0;
          local_e8[0] = (pointer)0x0;
          local_e8[1] = (pointer)0x0;
          ppSVar5 = (propName->integrableObjects_).
                    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar6 = (StuntDouble *)0x0;
          if (ppSVar5 !=
              (propName->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pSVar6 = *ppSVar5;
          }
          dVar1 = 0.0;
          local_a8 = pMVar4;
          if (pSVar6 != (StuntDouble *)0x0) {
            lVar7 = 0;
            dVar1 = 0.0;
            do {
              local_c8 = dVar1;
              std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
              push_back((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         *)local_108,
                        (this_00->
                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_start +
                        pSVar6->globalIntegrableObjectIndex_);
              dVar1 = pSVar6->mass_;
              local_68[0] = (pointer)0x0;
              local_68[1] = (pointer)0x0;
              local_68[2] = (pointer)0x0;
              lVar3 = 0;
              do {
                local_68[lVar3] =
                     (pointer)(*(double *)
                                ((long)((Vector<double,_3U> *)local_108._0_8_)->data_ +
                                lVar3 * 8 + lVar7) * dVar1);
                lVar3 = lVar3 + 1;
              } while (lVar3 != 3);
              local_98[0] = (pointer)0x0;
              local_98[1] = (pointer)0x0;
              local_88 = (pointer)0x0;
              lVar3 = 0;
              do {
                local_98[lVar3] = (pointer)((double)local_e8[lVar3] + (double)local_68[lVar3]);
                lVar3 = lVar3 + 1;
              } while (lVar3 != 3);
              local_d8 = local_88;
              local_e8[0] = local_98[0];
              local_e8[1] = local_98[1];
              ppSVar5 = ppSVar5 + 1;
              if (ppSVar5 ==
                  (propName->integrableObjects_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                pSVar6 = (StuntDouble *)0x0;
              }
              else {
                pSVar6 = *ppSVar5;
              }
              dVar1 = local_c8 + dVar1;
              lVar7 = lVar7 + 0x18;
            } while (pSVar6 != (StuntDouble *)0x0);
          }
          lVar7 = 0;
          do {
            local_e8[lVar7] = (pointer)((double)local_e8[lVar7] / dVar1);
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
                    (&local_80,
                     (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     local_108);
          this = local_b0;
          local_48.super_Vector<double,_3U>.data_[2] = (double)local_d8;
          local_48.super_Vector<double,_3U>.data_[0] = (double)local_e8[0];
          local_48.super_Vector<double,_3U>.data_[1] = (double)local_e8[1];
          MolecularRestraint::setReferenceStructure(local_a8,&local_80,&local_48);
          if (local_80.
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_80.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_80.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_80.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((pointer)local_108._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
          }
        }
      }
      if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
    }
    propName = SimInfo::nextMolecule(this->info_,&local_a0);
  }
  painCave.errMsg[0] = painCave.errMsg[0];
  painCave.errMsg[1] = painCave.errMsg[1];
  painCave.errMsg[2] = painCave.errMsg[2];
  painCave.errMsg[3] = painCave.errMsg[3];
  painCave.errMsg[4] = painCave.errMsg[4];
  painCave.errMsg[5] = painCave.errMsg[5];
  painCave.errMsg[6] = painCave.errMsg[6];
  painCave.errMsg[7] = painCave.errMsg[7];
  painCave.errMsg[8] = painCave.errMsg[8];
  painCave.errMsg[9] = painCave.errMsg[9];
  painCave.errMsg[10] = painCave.errMsg[10];
  painCave.errMsg[0xb] = painCave.errMsg[0xb];
  painCave.errMsg[0xc] = painCave.errMsg[0xc];
  painCave.errMsg[0xd] = painCave.errMsg[0xd];
  painCave.errMsg[0xe] = painCave.errMsg[0xe];
  painCave.errMsg[0xf] = painCave.errMsg[0xf];
  painCave.errMsg[0x10] = painCave.errMsg[0x10];
  painCave.errMsg[0x11] = painCave.errMsg[0x11];
  painCave.errMsg[0x12] = painCave.errMsg[0x12];
  painCave.errMsg[0x13] = painCave.errMsg[0x13];
  painCave.errMsg[0x14] = painCave.errMsg[0x14];
  painCave.errMsg[0x15] = painCave.errMsg[0x15];
  painCave.errMsg[0x16] = painCave.errMsg[0x16];
  painCave.errMsg[0x17] = painCave.errMsg[0x17];
  painCave.errMsg[0x18] = painCave.errMsg[0x18];
  painCave.errMsg[0x19] = painCave.errMsg[0x19];
  painCave.errMsg[0x1a] = painCave.errMsg[0x1a];
  painCave.errMsg[0x1b] = painCave.errMsg[0x1b];
  painCave.errMsg[0x1c] = painCave.errMsg[0x1c];
  painCave.errMsg[0x1d] = painCave.errMsg[0x1d];
  painCave.errMsg[0x1e] = painCave.errMsg[0x1e];
  painCave.errMsg[0x1f] = painCave.errMsg[0x1f];
  painCave.errMsg[0x20] = painCave.errMsg[0x20];
  painCave.errMsg[0x21] = painCave.errMsg[0x21];
  painCave.errMsg[0x22] = painCave.errMsg[0x22];
  painCave.errMsg[0x23] = painCave.errMsg[0x23];
  painCave.errMsg[0x24] = painCave.errMsg[0x24];
  painCave.errMsg[0x25] = painCave.errMsg[0x25];
  painCave.errMsg[0x26] = painCave.errMsg[0x26];
  painCave.errMsg[0x27] = painCave.errMsg[0x27];
  painCave.errMsg[0x28] = painCave.errMsg[0x28];
  painCave.errMsg[0x29] = painCave.errMsg[0x29];
  painCave.errMsg[0x2a] = painCave.errMsg[0x2a];
  painCave.errMsg[0x2b] = painCave.errMsg[0x2b];
  painCave.errMsg[0x2c] = painCave.errMsg[0x2c];
  painCave.errMsg[0x2d] = painCave.errMsg[0x2d];
  painCave.errMsg[0x2e] = painCave.errMsg[0x2e];
  painCave.errMsg[0x2f] = painCave.errMsg[0x2f];
  painCave.errMsg[0x30] = painCave.errMsg[0x30];
  painCave.errMsg[0x31] = painCave.errMsg[0x31];
  painCave.isFatal = painCave.isFatal;
  painCave.severity = painCave.severity;
  return;
}

Assistant:

void RestReader::readReferenceStructure() {
    // We need temporary storage to keep track of all StuntDouble positions
    // in case some of the restraints are molecular (i.e. if they use
    // multiple SD positions to determine restrained orientations or positions:

    all_pos_.clear();
    all_pos_.resize(info_->getNGlobalIntegrableObjects());

    // Restraint files are just standard dump files, but with the reference
    // structure stored in the first frame (frame 0).
    // RestReader overloads readSet and explicitly handles all of the
    // ObjectRestraints in that method:

    scanFile();

    readSet();

    // all ObjectRestraints have been handled, now we have to worry about
    // molecular restraints:

    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;

    // no need to worry about parallel molecules, as molecules are not
    // split across processor boundaries.  Just loop over all molecules
    // we know about:

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      // is this molecule restrained?
      std::shared_ptr<GenericData> data = mol->getPropertyByName("Restraint");

      if (data != nullptr) {
        // make sure we can reinterpret the generic data as restraint data:

        std::shared_ptr<RestraintData> restData =
            std::dynamic_pointer_cast<RestraintData>(data);

        if (restData != nullptr) {
          // make sure we can reinterpet the restraint data as a
          // pointer to a MolecularRestraint:

          MolecularRestraint* mRest =
              dynamic_cast<MolecularRestraint*>(restData->getData());

          if (mRest == NULL) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "Can not cast RestraintData to MolecularRestraint\n");
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          } else {
            // now we need to pack the stunt doubles for the reference
            // structure:

            std::vector<Vector3d> ref;
            int count = 0;
            RealType mass, mTot;
            Vector3d COM(0.0);

            mTot = 0.0;
            // loop over the stunt doubles in this molecule in the order we
            // will be looping them in the restraint code:

            for (sd = mol->beginIntegrableObject(j); sd != NULL;
                 sd = mol->nextIntegrableObject(j)) {
              // push back the reference positions of the stunt
              // doubles from the *globally* sorted array of
              // positions:

              ref.push_back(all_pos_[sd->getGlobalIntegrableObjectIndex()]);
              mass  = sd->getMass();
              COM   = COM + mass * ref[count];
              mTot  = mTot + mass;
              count = count + 1;
            }
            COM /= mTot;
            mRest->setReferenceStructure(ref, COM);
          }
        }
      }
    }
  }